

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,int32_t *value,int base)

{
  numbers_internal *pnVar1;
  numbers_internal nVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  numbers_internal *in_RAX;
  uint uVar6;
  int iVar7;
  int *piVar8;
  numbers_internal *pnVar9;
  numbers_internal *pnVar10;
  numbers_internal *pnVar11;
  uint uVar12;
  
  uVar6 = (uint)value;
  piVar8 = (int *)text._M_str;
  pnVar10 = (numbers_internal *)text._M_len;
  *piVar8 = 0;
  if (pnVar10 == (numbers_internal *)0x0) {
LAB_001a4a2a:
    bVar5 = false;
  }
  else {
    pnVar9 = pnVar10;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[(byte)*pnVar9] & 8) == 0) break;
        pnVar9 = pnVar9 + 1;
      } while (pnVar9 < pnVar10 + (long)this);
    }
    pnVar11 = pnVar10 + 1;
    in_RAX = pnVar10;
    do {
      if (in_RAX + (long)this <= pnVar9) goto LAB_001a4a2a;
      pnVar1 = in_RAX + -1;
      pnVar11 = pnVar11 + -1;
      in_RAX = in_RAX + -1;
    } while (((&ascii_internal::kPropertyBits)[(byte)pnVar1[(long)this]] & 8) != 0);
    nVar2 = *pnVar9;
    pnVar1 = in_RAX + (long)this;
    in_RAX = (numbers_internal *)(ulong)(nVar2 == (numbers_internal)0x2d);
    if (((nVar2 == (numbers_internal)0x2d) || (nVar2 == (numbers_internal)0x2b)) &&
       (pnVar9 = pnVar9 + 1, pnVar1 + 1 <= pnVar9)) {
LAB_001a4ba9:
      bVar5 = false;
    }
    else {
      if (uVar6 == 0x10) {
        uVar12 = 0x10;
        if (((1 < (long)(pnVar11 + ((long)this - (long)pnVar9))) &&
            (*pnVar9 == (numbers_internal)0x30)) && (((byte)pnVar9[1] | 0x20) == 0x78)) {
LAB_001a4b93:
          pnVar9 = pnVar9 + 2;
          uVar12 = 0x10;
          if (pnVar1 + 1 <= pnVar9) goto LAB_001a4ba9;
        }
      }
      else if (uVar6 == 0) {
        if (((1 < (long)(pnVar11 + ((long)this - (long)pnVar9))) &&
            (*pnVar9 == (numbers_internal)0x30)) && (((byte)pnVar9[1] | 0x20) == 0x78))
        goto LAB_001a4b93;
        if ((long)(pnVar11 + ((long)this - (long)pnVar9)) < 1) {
          uVar12 = 10;
        }
        else {
          nVar2 = *pnVar9;
          pnVar9 = pnVar9 + (nVar2 == (numbers_internal)0x30);
          uVar12 = (uint)(nVar2 != (numbers_internal)0x30) * 2 + 8;
        }
      }
      else {
        uVar12 = uVar6;
        if (0x22 < uVar6 - 2) goto LAB_001a4ba9;
      }
      uVar6 = uVar12;
      this = pnVar11 + ((long)this - (long)pnVar9);
      bVar5 = true;
      pnVar10 = pnVar9;
    }
  }
  if (!bVar5) {
    return false;
  }
  if (((ulong)in_RAX & 1) == 0) {
    if ((int)uVar6 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x3dc,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                   );
    }
    iVar3 = *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + (ulong)uVar6 * 4);
    if ((1 < (int)uVar6) && ((int)(0x7fffffff / (ulong)uVar6) != iVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x3e1,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                   );
    }
    bVar5 = (long)this < 1;
    if (0 < (long)this) {
      pnVar9 = this + (long)pnVar10;
      iVar7 = 0;
      do {
        uVar12 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar10];
        if ((int)uVar12 < (int)uVar6) {
          if ((iVar3 < iVar7) || (iVar7 = iVar7 * uVar6, (int)(uVar12 ^ 0x7fffffff) < iVar7)) {
            *piVar8 = 0x7fffffff;
            goto LAB_001a4b43;
          }
          iVar7 = iVar7 + uVar12;
          bVar4 = true;
        }
        else {
          *piVar8 = iVar7;
LAB_001a4b43:
          bVar4 = false;
        }
        if (!bVar4) {
          return bVar5;
        }
        pnVar10 = pnVar10 + 1;
        bVar5 = pnVar10 >= pnVar9;
      } while (pnVar10 < pnVar9);
      goto LAB_001a4b62;
    }
  }
  else {
    iVar3 = *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase + (long)(int)uVar6 * 4)
    ;
    if ((1 < (int)uVar6) && (-0x80000000 / (int)uVar6 != iVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x404,
                    "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                   );
    }
    bVar5 = (long)this < 1;
    if (0 < (long)this) {
      pnVar9 = this + (long)pnVar10;
      iVar7 = 0;
      do {
        uVar12 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar10];
        if ((int)uVar12 < (int)uVar6) {
          if ((iVar7 < iVar3) || (iVar7 = iVar7 * uVar6, iVar7 < (int)(uVar12 | 0x80000000))) {
            *piVar8 = -0x80000000;
            goto LAB_001a4aa9;
          }
          iVar7 = iVar7 - uVar12;
          bVar4 = true;
        }
        else {
          *piVar8 = iVar7;
LAB_001a4aa9:
          bVar4 = false;
        }
        if (!bVar4) {
          return bVar5;
        }
        pnVar10 = pnVar10 + 1;
        bVar5 = pnVar10 >= pnVar9;
      } while (pnVar10 < pnVar9);
      goto LAB_001a4b62;
    }
  }
  bVar5 = (long)this < 1;
  iVar7 = 0;
LAB_001a4b62:
  *piVar8 = iVar7;
  return bVar5;
}

Assistant:

bool safe_strto32_base(absl::string_view text, int32_t* absl_nonnull value,
                       int base) {
  return safe_int_internal<int32_t>(text, value, base);
}